

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O2

Vector3 __thiscall pm::PinHole::rayDirection(PinHole *this,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  float fVar5;
  Vector3 VVar6;
  
  fVar1 = *(float *)(in_RSI + 0x38);
  fVar2 = *(float *)(in_RSI + 0x44);
  fVar3 = *(float *)(in_RSI + 0x58);
  fVar4 = *(float *)(in_RSI + 0x50);
  fVar5 = (y * (float)*(undefined8 *)(in_RSI + 0x3c) + (float)*(undefined8 *)(in_RSI + 0x30) * x) -
          fVar3 * *(float *)(in_RSI + 0x48);
  (this->super_Camera)._vptr_Camera =
       (_func_int **)
       CONCAT44((y * (float)((ulong)*(undefined8 *)(in_RSI + 0x3c) >> 0x20) +
                (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20) * x) -
                *(float *)(in_RSI + 0x4c) * fVar3,fVar5);
  (this->super_Camera).type_ = (Type)((fVar2 * y + fVar1 * x) - fVar4 * fVar3);
  Vector3::normalize((Vector3 *)this);
  VVar6.z = fVar5;
  VVar6.x = (float)(int)extraout_XMM0_Qa;
  VVar6.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar6;
}

Assistant:

Vector3 PinHole::rayDirection(float x, float y) const
{
	Vector3 dir = x * u_ + y * v_ - distance_ * w_;
	dir.normalize();

	return dir;
}